

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O1

HFactor * __thiscall HFactor::operator=(HFactor *this,HFactor *param_1)

{
  LogData *pLVar1;
  LogData *pLVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  HighsInt HVar6;
  HighsInt HVar7;
  undefined4 uVar8;
  HighsInt HVar9;
  FILE *pFVar10;
  bool *pbVar11;
  bool *pbVar12;
  void *pvVar13;
  bool bVar14;
  undefined2 uVar15;
  undefined3 uVar16;
  long lVar17;
  HighsInt *pHVar18;
  HighsInt *pHVar19;
  byte bVar20;
  
  bVar20 = 0;
  this->rank_deficiency = param_1->rank_deficiency;
  uVar3 = *(undefined4 *)((long)&param_1->build_realTick + 4);
  uVar4 = *(undefined4 *)&param_1->build_synthetic_tick;
  uVar5 = *(undefined4 *)((long)&param_1->build_synthetic_tick + 4);
  *(undefined4 *)&this->build_realTick = *(undefined4 *)&param_1->build_realTick;
  *(undefined4 *)((long)&this->build_realTick + 4) = uVar3;
  *(undefined4 *)&this->build_synthetic_tick = uVar4;
  *(undefined4 *)((long)&this->build_synthetic_tick + 4) = uVar5;
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_with_no_pivot,&param_1->row_with_no_pivot);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_with_no_pivot,&param_1->col_with_no_pivot);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->var_with_no_pivot,&param_1->var_with_no_pivot);
  (this->refactor_info_).use = (param_1->refactor_info_).use;
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->refactor_info_).pivot_row,&(param_1->refactor_info_).pivot_row);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->refactor_info_).pivot_var,&(param_1->refactor_info_).pivot_var);
  std::vector<signed_char,_std::allocator<signed_char>_>::_M_move_assign
            (&(this->refactor_info_).pivot_type,&(param_1->refactor_info_).pivot_type);
  (this->refactor_info_).build_synthetic_tick = (param_1->refactor_info_).build_synthetic_tick;
  pHVar18 = &param_1->basis_matrix_num_el;
  pHVar19 = &this->basis_matrix_num_el;
  for (lVar17 = 0xe; lVar17 != 0; lVar17 = lVar17 + -1) {
    *(undefined8 *)pHVar19 = *(undefined8 *)pHVar18;
    pHVar18 = pHVar18 + (ulong)bVar20 * -4 + 2;
    pHVar19 = pHVar19 + (ulong)bVar20 * -4 + 2;
  }
  pLVar1 = (param_1->log_data)._M_t.
           super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
           super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
           super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl;
  (param_1->log_data)._M_t.
  super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
  super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
  super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl = (LogData *)0x0;
  pLVar2 = (this->log_data)._M_t.
           super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
           super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
           super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl;
  (this->log_data)._M_t.
  super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
  super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
  super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl = pLVar1;
  if (pLVar2 != (LogData *)0x0) {
    operator_delete(pLVar2);
  }
  pFVar10 = (param_1->log_options).log_stream;
  pbVar11 = (param_1->log_options).output_flag;
  pbVar12 = (param_1->log_options).log_to_console;
  pHVar18 = (param_1->log_options).log_dev_level;
  pvVar13 = (param_1->log_options).user_log_callback_data;
  (this->log_options).user_log_callback = (param_1->log_options).user_log_callback;
  (this->log_options).user_log_callback_data = pvVar13;
  (this->log_options).log_to_console = pbVar12;
  (this->log_options).log_dev_level = pHVar18;
  (this->log_options).log_stream = pFVar10;
  (this->log_options).output_flag = pbVar11;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(&(this->log_options).user_callback,&(param_1->log_options).user_callback);
  (this->log_options).user_callback_data = (param_1->log_options).user_callback_data;
  (this->log_options).user_callback_active = (param_1->log_options).user_callback_active;
  bVar14 = param_1->debug_report_;
  uVar15 = *(undefined2 *)&param_1->field_0x192;
  HVar6 = param_1->basis_matrix_limit_size;
  HVar7 = param_1->update_method;
  uVar3 = *(undefined4 *)&param_1->field_0x19c;
  uVar4 = *(undefined4 *)&param_1->field_0x19c;
  uVar5 = *(undefined4 *)&param_1->build_timer_;
  uVar8 = *(undefined4 *)((long)&param_1->build_timer_ + 4);
  HVar9 = param_1->nwork;
  this->use_original_HFactor_logic = param_1->use_original_HFactor_logic;
  this->debug_report_ = bVar14;
  *(undefined2 *)&this->field_0x192 = uVar15;
  this->basis_matrix_limit_size = HVar6;
  this->update_method = HVar7;
  *(undefined4 *)&this->field_0x19c = uVar3;
  *(undefined4 *)&this->field_0x19c = uVar4;
  *(undefined4 *)&this->build_timer_ = uVar5;
  *(undefined4 *)((long)&this->build_timer_ + 4) = uVar8;
  this->nwork = HVar9;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->iwork,&param_1->iwork);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->dwork,&param_1->dwork);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->b_var,&param_1->b_var);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->b_start,&param_1->b_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->b_index,&param_1->b_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->b_value,&param_1->b_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->permute,&param_1->permute);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_var,&param_1->mc_var);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_start,&param_1->mc_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_count_a,&param_1->mc_count_a);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_count_n,&param_1->mc_count_n);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_space,&param_1->mc_space);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_index,&param_1->mc_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->mc_value,&param_1->mc_value);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->mc_min_pivot,&param_1->mc_min_pivot);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_start,&param_1->mr_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_count,&param_1->mr_count);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_space,&param_1->mr_space);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->mr_count_before,&param_1->mr_count_before);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_index,&param_1->mr_index);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->mwz_column_index,&param_1->mwz_column_index);
  std::vector<char,_std::allocator<char>_>::_M_move_assign
            (&this->mwz_column_mark,&param_1->mwz_column_mark);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->mwz_column_array,&param_1->mwz_column_array);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_link_first,&param_1->col_link_first);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_link_next,&param_1->col_link_next);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_link_last,&param_1->col_link_last);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_link_first,&param_1->row_link_first);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_link_next,&param_1->row_link_next);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_link_last,&param_1->row_link_last);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->l_pivot_lookup,&param_1->l_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->l_pivot_index,&param_1->l_pivot_index);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->l_start,&param_1->l_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->l_index,&param_1->l_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->l_value,&param_1->l_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->lr_start,&param_1->lr_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->lr_index,&param_1->lr_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->lr_value,&param_1->lr_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->u_pivot_lookup,&param_1->u_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->u_pivot_index,&param_1->u_pivot_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->u_pivot_value,&param_1->u_pivot_value);
  HVar6 = param_1->u_total_x;
  this->u_merit_x = param_1->u_merit_x;
  this->u_total_x = HVar6;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->u_start,&param_1->u_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->u_last_p,&param_1->u_last_p);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->u_index,&param_1->u_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->u_value,&param_1->u_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_start,&param_1->ur_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_lastp,&param_1->ur_lastp);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_space,&param_1->ur_space);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_index,&param_1->ur_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->ur_value,&param_1->ur_value);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->pf_pivot_value,&param_1->pf_pivot_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->pf_pivot_index,&param_1->pf_pivot_index);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->pf_start,&param_1->pf_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->pf_index,&param_1->pf_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->pf_value,&param_1->pf_value);
  HVar6 = (param_1->rhs_).count;
  (this->rhs_).size = (param_1->rhs_).size;
  (this->rhs_).count = HVar6;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&(this->rhs_).index,&(param_1->rhs_).index)
  ;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->rhs_).array,&(param_1->rhs_).array);
  (this->rhs_).synthetic_tick = (param_1->rhs_).synthetic_tick;
  std::vector<char,_std::allocator<char>_>::_M_move_assign
            (&(this->rhs_).cwork,&(param_1->rhs_).cwork);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&(this->rhs_).iwork,&(param_1->rhs_).iwork)
  ;
  uVar3 = *(undefined4 *)((long)&(param_1->rhs_).next + 4);
  bVar14 = (param_1->rhs_).packFlag;
  uVar16 = *(undefined3 *)&(param_1->rhs_).field_0x79;
  HVar6 = (param_1->rhs_).packCount;
  *(undefined4 *)&(this->rhs_).next = *(undefined4 *)&(param_1->rhs_).next;
  *(undefined4 *)((long)&(this->rhs_).next + 4) = uVar3;
  (this->rhs_).packFlag = bVar14;
  *(undefined3 *)&(this->rhs_).field_0x79 = uVar16;
  (this->rhs_).packCount = HVar6;
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->rhs_).packIndex,&(param_1->rhs_).packIndex);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->rhs_).packValue,&(param_1->rhs_).packValue);
  return this;
}

Assistant:

HFactor()
      : build_realTick(0.0),
        build_synthetic_tick(0.0),
        rank_deficiency(0),
        basis_matrix_num_el(0),
        invert_num_el(0),
        kernel_dim(0),
        kernel_num_el(0),
        num_row(0),
        num_col(0),
        num_basic(0),
        a_matrix_valid(false),
        a_start(nullptr),
        a_index(nullptr),
        a_value(nullptr),
        basic_index(nullptr),
        pivot_threshold(0.0),
        pivot_tolerance(0.0),
        highs_debug_level(0),
        time_limit_(0.0),
        use_original_HFactor_logic(false),
        debug_report_(false),
        basis_matrix_limit_size(0),
        update_method(0),
        build_timer_(nullptr),
        nwork(0),
        u_merit_x(0),
        // clang-format off
        u_total_x(0) {}